

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O2

btVector3 ThreePlaneIntersection(btPlane *p0,btPlane *p1,btPlane *p2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  btVector3 bVar5;
  btVector3 bVar6;
  btVector3 bVar7;
  btVector3 N3;
  btVector3 N2;
  btVector3 N1;
  float local_a8;
  float fStack_a4;
  float local_98;
  float local_88;
  float local_78;
  float fStack_74;
  btVector3 local_68;
  btVector3 local_58;
  btVector3 local_48;
  
  local_48.m_floats._0_8_ = *(undefined8 *)(p0->normal).m_floats;
  local_48.m_floats._8_8_ = *(undefined8 *)((p0->normal).m_floats + 2);
  local_58.m_floats._0_8_ = *(undefined8 *)(p1->normal).m_floats;
  local_58.m_floats._8_8_ = *(undefined8 *)((p1->normal).m_floats + 2);
  local_68.m_floats._0_8_ = *(undefined8 *)(p2->normal).m_floats;
  local_68.m_floats._8_8_ = *(undefined8 *)((p2->normal).m_floats + 2);
  bVar5 = btVector3::cross(&local_58,&local_68);
  bVar6 = btVector3::cross(&local_68,&local_48);
  bVar7 = btVector3::cross(&local_48,&local_58);
  local_a8 = bVar5.m_floats[0];
  fStack_a4 = bVar5.m_floats[1];
  local_98 = bVar5.m_floats[2];
  fVar4 = -1.0 / (local_48.m_floats[2] * local_98 +
                 local_48.m_floats[0] * local_a8 + fStack_a4 * local_48.m_floats[1]);
  fVar1 = p0->dist;
  fVar2 = p1->dist;
  local_88 = bVar6.m_floats[2];
  fVar3 = p2->dist;
  local_78 = bVar6.m_floats[0];
  fStack_74 = bVar6.m_floats[1];
  bVar5.m_floats[2] = (bVar7.m_floats[2] * fVar3 + local_88 * fVar2 + local_98 * fVar1) * fVar4;
  bVar5.m_floats[0] = (bVar7.m_floats[0] * fVar3 + fVar2 * local_78 + fVar1 * local_a8) * fVar4;
  bVar5.m_floats[1] = (bVar7.m_floats[1] * fVar3 + fVar2 * fStack_74 + fVar1 * fStack_a4) * fVar4;
  bVar5.m_floats[3] = 0.0;
  return (btVector3)bVar5.m_floats;
}

Assistant:

btVector3  ThreePlaneIntersection(const btPlane &p0,const btPlane &p1, const btPlane &p2)
{
	btVector3 N1 = p0.normal;
	btVector3 N2 = p1.normal;
	btVector3 N3 = p2.normal;

	btVector3 n2n3; n2n3 = N2.cross(N3);
	btVector3 n3n1; n3n1 = N3.cross(N1);
	btVector3 n1n2; n1n2 = N1.cross(N2);

	btScalar quotient = (N1.dot(n2n3));

	btAssert(btFabs(quotient) > btScalar(0.000001));
	
	quotient = btScalar(-1.) / quotient;
	n2n3 *= p0.dist;
	n3n1 *= p1.dist;
	n1n2 *= p2.dist;
	btVector3 potentialVertex = n2n3;
	potentialVertex += n3n1;
	potentialVertex += n1n2;
	potentialVertex *= quotient;

	btVector3 result(potentialVertex.getX(),potentialVertex.getY(),potentialVertex.getZ());
	return result;

}